

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS
ref_smooth_tri_ideal_uv
          (REF_GRID ref_grid,REF_INT node,REF_INT tri,REF_DBL *ideal_uv,REF_DBL target_q)

{
  REF_NODE ref_node_00;
  REF_GEOM ref_geom_00;
  uint uVar1;
  double local_2b8;
  double local_2b0;
  double local_2a0;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL verbose;
  REF_INT search;
  REF_INT tries;
  REF_DBL q3;
  REF_DBL q2;
  REF_DBL q1;
  REF_DBL step3;
  REF_DBL step2;
  REF_DBL step1;
  REF_DBL denom;
  REF_DBL num;
  REF_DBL beta;
  REF_DBL slope;
  REF_DBL dq_duv1 [2];
  REF_DBL dq_duv0 [2];
  REF_DBL dq_duv [2];
  REF_DBL dq_dxyz [3];
  double local_198;
  REF_DBL dxyz_duv [15];
  REF_DBL local_118;
  REF_DBL xyz [3];
  REF_DBL min_uv_area;
  REF_DBL q;
  REF_DBL q0;
  REF_DBL uv [2];
  REF_DBL uv_orig [2];
  REF_INT geom;
  REF_INT id;
  REF_INT n1;
  REF_INT n0;
  REF_INT nodes [27];
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_DBL target_q_local;
  REF_DBL *ideal_uv_local;
  REF_INT tri_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_geom_00 = ref_grid->geom;
  *ideal_uv = 0.0;
  ideal_uv[1] = 0.0;
  ref_grid_local._4_4_ = ref_cell_nodes(ref_grid->cell[3],tri,&n1);
  if (ref_grid_local._4_4_ == 0) {
    id = -1;
    geom = -1;
    if (node == n1) {
      id = n0;
      geom = nodes[0];
    }
    if (node == n0) {
      id = nodes[0];
      geom = n1;
    }
    if (node == nodes[0]) {
      id = n1;
      geom = n0;
    }
    if ((id == -1) || (geom == -1)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x1a3,"ref_smooth_tri_ideal_uv","empty triangle side");
      ref_grid_local._4_4_ = 1;
    }
    else {
      n0 = id;
      nodes[0] = geom;
      n1 = node;
      ref_grid_local._4_4_ = ref_geom_unique_id(ref_geom_00,node,2,(REF_INT *)((long)uv_orig + 0xc))
      ;
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = ref_geom_tuv(ref_geom_00,node,2,uv_orig[1]._4_4_,uv + 1);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ =
               ref_geom_find(ref_geom_00,node,2,uv_orig[1]._4_4_,(REF_INT *)(uv_orig + 1));
          if (ref_grid_local._4_4_ == 0) {
            *ideal_uv = uv[1];
            ideal_uv[1] = uv_orig[0];
            ref_grid_local._4_4_ = ref_node_tri_quality(ref_node_00,&n1,&q);
            if (ref_grid_local._4_4_ == 0) {
              q0 = uv[1];
              uv[0] = uv_orig[0];
              dq_duv1[1] = 0.0;
              dq_duv0[0] = 0.0;
              min_uv_area = q;
              for (verbose = 0; verbose < 0x1e && min_uv_area < target_q; verbose = verbose + 1) {
                uVar1 = ref_geom_add(ref_geom_00,node,2,uv_orig[1]._4_4_,&q0);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x1b7,"ref_smooth_tri_ideal_uv",(ulong)uVar1,"set uv");
                  return uVar1;
                }
                uVar1 = ref_smooth_tri_uv_area_around(ref_grid,node,xyz + 2);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x1b9,"ref_smooth_tri_ideal_uv",(ulong)uVar1,"min area");
                  return uVar1;
                }
                if (xyz[2] <= ref_node_00->min_uv_area) {
                  q0 = uv[1];
                  uv[0] = uv_orig[0];
                  break;
                }
                uVar1 = ref_geom_constrain(ref_grid,node);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x1c0,"ref_smooth_tri_ideal_uv",(ulong)uVar1,"constrain");
                  return uVar1;
                }
                uVar1 = ref_node_tri_dquality_dnode0(ref_node_00,&n1,&min_uv_area,dq_duv + 1);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x1c1,"ref_smooth_tri_ideal_uv",(ulong)uVar1,"qual");
                  return uVar1;
                }
                uVar1 = ref_egads_eval(ref_geom_00,uv_orig[1]._0_4_,&local_118,&local_198);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x1c2,"ref_smooth_tri_ideal_uv",(ulong)uVar1,"eval face");
                  return uVar1;
                }
                slope = dq_dxyz[1] * dxyz_duv[1] + dq_duv[1] * local_198 + dq_dxyz[0] * dxyz_duv[0];
                dq_duv1[0] = dq_dxyz[1] * dxyz_duv[4] +
                             dq_duv[1] * dxyz_duv[2] + dq_dxyz[0] * dxyz_duv[3];
                if (verbose == 0) {
                  num = 0.0;
                  dq_duv0[1] = slope;
                  dq_duv[0] = dq_duv1[0];
                }
                else {
                  denom = slope * (slope - dq_duv1[1]) + dq_duv1[0] * (dq_duv1[0] - dq_duv0[0]);
                  step1 = dq_duv1[1] * dq_duv1[1] + dq_duv0[0] * dq_duv0[0];
                  num = 0.0;
                  if (step1 * 1e+20 <= 0.0) {
                    local_2a0 = -(step1 * 1e+20);
                  }
                  else {
                    local_2a0 = step1 * 1e+20;
                  }
                  local_2b0 = denom;
                  if (denom <= 0.0) {
                    local_2b0 = -denom;
                  }
                  if (local_2b0 < local_2a0) {
                    num = denom / step1;
                  }
                  if (0.0 <= num) {
                    local_2b8 = num;
                  }
                  else {
                    local_2b8 = 0.0;
                  }
                  num = local_2b8;
                  dq_duv0[1] = local_2b8 * dq_duv0[1] + slope;
                  dq_duv[0] = local_2b8 * dq_duv[0] + dq_duv1[0];
                }
                dq_duv1[1] = slope;
                dq_duv0[0] = dq_duv1[0];
                beta = sqrt(dq_duv0[1] * dq_duv0[1] + dq_duv[0] * dq_duv[0]);
                q1 = (1.0 - min_uv_area) / beta;
                step2 = 0.0;
                step3 = (q1 + 0.0) * 0.5;
                uVar1 = ref_smooth_tri_quality
                                  (ref_grid,node,uv_orig[1]._4_4_,&n1,&q0,dq_duv0 + 1,0.0,&q2);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x1e3,"ref_smooth_tri_ideal_uv",(ulong)uVar1,"set uv for q1");
                  return uVar1;
                }
                uVar1 = ref_smooth_tri_quality
                                  (ref_grid,node,uv_orig[1]._4_4_,&n1,&q0,dq_duv0 + 1,step3,&q3);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x1e6,"ref_smooth_tri_ideal_uv",(ulong)uVar1,"set uv for q2");
                  return uVar1;
                }
                uVar1 = ref_smooth_tri_quality
                                  (ref_grid,node,uv_orig[1]._4_4_,&n1,&q0,dq_duv0 + 1,q1,
                                   (REF_DBL *)&search);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x1e9,"ref_smooth_tri_ideal_uv",(ulong)uVar1,"set uv for q3");
                  return uVar1;
                }
                for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 0xf;
                    ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                  if (q2 <= _search) {
                    step2 = step3;
                    q2 = q3;
                  }
                  else {
                    q1 = step3;
                    _search = q3;
                  }
                  step3 = (step2 + q1) * 0.5;
                  uVar1 = ref_smooth_tri_quality
                                    (ref_grid,node,uv_orig[1]._4_4_,&n1,&q0,dq_duv0 + 1,step3,&q3);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x1f5,"ref_smooth_tri_ideal_uv",(ulong)uVar1,"set uv for q2");
                    return uVar1;
                  }
                }
                if (q3 < q2) {
                  uVar1 = ref_smooth_tri_quality
                                    (ref_grid,node,uv_orig[1]._4_4_,&n1,&q0,dq_duv0 + 1,step2,&q2);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x1fa,"ref_smooth_tri_ideal_uv",(ulong)uVar1,"set uv for q1");
                    return uVar1;
                  }
                  uVar1 = ref_geom_tuv(ref_geom_00,node,2,uv_orig[1]._4_4_,&q0);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x1fb,"ref_smooth_tri_ideal_uv",(ulong)uVar1,"uv");
                    return uVar1;
                  }
                  break;
                }
                uVar1 = ref_geom_tuv(ref_geom_00,node,2,uv_orig[1]._4_4_,&q0);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x1fe,"ref_smooth_tri_ideal_uv",(ulong)uVar1,"uv");
                  return uVar1;
                }
              }
              ref_grid_local._4_4_ = ref_geom_add(ref_geom_00,node,2,uv_orig[1]._4_4_,uv + 1);
              if (ref_grid_local._4_4_ == 0) {
                ref_grid_local._4_4_ = ref_geom_constrain(ref_grid,node);
                if (ref_grid_local._4_4_ == 0) {
                  *ideal_uv = q0;
                  ideal_uv[1] = uv[0];
                  ref_grid_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x20d,"ref_smooth_tri_ideal_uv",(ulong)ref_grid_local._4_4_,"constrain");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x20c,"ref_smooth_tri_ideal_uv",(ulong)ref_grid_local._4_4_,"set uv");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x1af,"ref_smooth_tri_ideal_uv",(ulong)ref_grid_local._4_4_,"qual");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x1ab,"ref_smooth_tri_ideal_uv",(ulong)ref_grid_local._4_4_,"geom");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x1aa,"ref_smooth_tri_ideal_uv",(ulong)ref_grid_local._4_4_,"uv");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x1a9,"ref_smooth_tri_ideal_uv",(ulong)ref_grid_local._4_4_,"id");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x193,
           "ref_smooth_tri_ideal_uv",(ulong)ref_grid_local._4_4_,"get tri");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tri_ideal_uv(REF_GRID ref_grid,
                                                  REF_INT node, REF_INT tri,
                                                  REF_DBL *ideal_uv,
                                                  REF_DBL target_q) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT n0, n1;
  REF_INT id, geom;
  REF_DBL uv_orig[2];
  REF_DBL uv[2];
  REF_DBL q0, q;
  REF_DBL min_uv_area;
  REF_DBL xyz[3], dxyz_duv[15], dq_dxyz[3], dq_duv[2], dq_duv0[2], dq_duv1[2];
  REF_DBL slope, beta, num, denom;
  REF_DBL step1, step2, step3, q1, q2, q3;
  REF_INT tries, search;
  REF_BOOL verbose = REF_FALSE;

  ideal_uv[0] = 0.0; /* initialized warning suppression */
  ideal_uv[1] = 0.0;

  RSS(ref_cell_nodes(ref_grid_tri(ref_grid), tri, nodes), "get tri");
  n0 = REF_EMPTY;
  n1 = REF_EMPTY;
  if (node == nodes[0]) {
    n0 = nodes[1];
    n1 = nodes[2];
  }
  if (node == nodes[1]) {
    n0 = nodes[2];
    n1 = nodes[0];
  }
  if (node == nodes[2]) {
    n0 = nodes[0];
    n1 = nodes[1];
  }
  if (n0 == REF_EMPTY || n1 == REF_EMPTY) {
    THROW("empty triangle side");
  }
  nodes[0] = node;
  nodes[1] = n0;
  nodes[2] = n1;

  RSS(ref_geom_unique_id(ref_geom, node, REF_GEOM_FACE, &id), "id");
  RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, id, uv_orig), "uv");
  RSS(ref_geom_find(ref_geom, node, REF_GEOM_FACE, id, &geom), "geom");
  ideal_uv[0] = uv_orig[0]; /* return meaning value on error */
  ideal_uv[1] = uv_orig[1];

  RSS(ref_node_tri_quality(ref_node, nodes, &q0), "qual");

  uv[0] = uv_orig[0];
  uv[1] = uv_orig[1];
  dq_duv0[0] = 0; /* uninit warning */
  dq_duv0[1] = 0;
  q = q0;
  for (tries = 0; tries < 30 && q < target_q; tries++) {
    RSS(ref_geom_add(ref_geom, node, REF_GEOM_FACE, id, uv), "set uv");
    RSS(ref_smooth_tri_uv_area_around(ref_grid, node, &min_uv_area),
        "min area");
    if (min_uv_area <=
        ref_node_min_uv_area(ref_node)) { /* protects constrain */
      uv[0] = uv_orig[0];
      uv[1] = uv_orig[1];
      break;
    }
    RSS(ref_geom_constrain(ref_grid, node), "constrain");
    RSS(ref_node_tri_dquality_dnode0(ref_node, nodes, &q, dq_dxyz), "qual");
    RSS(ref_egads_eval(ref_geom, geom, xyz, dxyz_duv), "eval face");
    dq_duv1[0] = dq_dxyz[0] * dxyz_duv[0] + dq_dxyz[1] * dxyz_duv[1] +
                 dq_dxyz[2] * dxyz_duv[2];
    dq_duv1[1] = dq_dxyz[0] * dxyz_duv[3] + dq_dxyz[1] * dxyz_duv[4] +
                 dq_dxyz[2] * dxyz_duv[5];

    if (0 == tries) {
      beta = 0;
      dq_duv[0] = dq_duv1[0];
      dq_duv[1] = dq_duv1[1];
    } else {
      /* fletcher-reeves */
      num = dq_duv1[0] * dq_duv1[0] + dq_duv1[1] * dq_duv1[1];
      denom = dq_duv0[0] * dq_duv0[0] + dq_duv0[1] * dq_duv0[1];
      /* polak-ribiere */
      num = dq_duv1[0] * (dq_duv1[0] - dq_duv0[0]) +
            dq_duv1[1] * (dq_duv1[1] - dq_duv0[1]);
      denom = dq_duv0[0] * dq_duv0[0] + dq_duv0[1] * dq_duv0[1];
      beta = 0;
      if (ref_math_divisible(num, denom)) beta = num / denom;
      beta = MAX(0.0, beta);
      dq_duv[0] = dq_duv1[0] + beta * dq_duv[0];
      dq_duv[1] = dq_duv1[1] + beta * dq_duv[1];
    }
    dq_duv0[0] = dq_duv1[0];
    dq_duv0[1] = dq_duv1[1];

    slope = sqrt(dq_duv[0] * dq_duv[0] + dq_duv[1] * dq_duv[1]);
    step3 = (1.0 - q) / slope;
    step1 = 0;
    step2 = 0.5 * (step1 + step3);
    RSS(ref_smooth_tri_quality(ref_grid, node, id, nodes, uv, dq_duv, step1,
                               &q1),
        "set uv for q1");
    RSS(ref_smooth_tri_quality(ref_grid, node, id, nodes, uv, dq_duv, step2,
                               &q2),
        "set uv for q2");
    RSS(ref_smooth_tri_quality(ref_grid, node, id, nodes, uv, dq_duv, step3,
                               &q3),
        "set uv for q3");
    for (search = 0; search < 15; search++) {
      if (q1 > q3) {
        step3 = step2;
        q3 = q2;
      } else {
        step1 = step2;
        q1 = q2;
      }
      step2 = 0.5 * (step1 + step3);
      RSS(ref_smooth_tri_quality(ref_grid, node, id, nodes, uv, dq_duv, step2,
                                 &q2),
          "set uv for q2");
    }
    if (q1 > q2) { /* could not improve */
      RSS(ref_smooth_tri_quality(ref_grid, node, id, nodes, uv, dq_duv, step1,
                                 &q1),
          "set uv for q1");
      RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, id, uv), "uv");
      break; /* give up */
    }
    RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, id, uv), "uv");

    if (verbose && tries > 25) {
      printf(" slow conv %2d    q %f dq_duv1 %f %f\n", tries, q2, dq_duv1[0],
             dq_duv1[1]);
      printf("              step %f dq_duv  %f %f beta %f\n", step2, dq_duv[0],
             dq_duv[1], beta);
    }
  }

  if (verbose && q < target_q) {
    printf(" bad ideal q %f dq_duv %f %f\n", q, dq_duv[0], dq_duv[1]);
  }

  RSS(ref_geom_add(ref_geom, node, REF_GEOM_FACE, id, uv_orig), "set uv");
  RSS(ref_geom_constrain(ref_grid, node), "constrain");

  ideal_uv[0] = uv[0];
  ideal_uv[1] = uv[1];

  return REF_SUCCESS;
}